

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

Scope * __thiscall Scope::SortAndUnique(Scope *this)

{
  const_iterator __position;
  uint *puVar1;
  
  Sort(this);
  __position._M_current =
       (this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  do {
    puVar1 = __position._M_current;
    __position._M_current = puVar1 + 1;
    while( true ) {
      if (__position._M_current ==
          (this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return this;
      }
      if (puVar1[1] != *puVar1) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase(&this->super_SDT,__position);
    }
  } while( true );
}

Assistant:

Scope& Scope::SortAndUnique()
{
    Sort();
    SDT::iterator prev=begin();
    for (SDT::iterator it=++begin();it!=end();)
    {
        if (*it==*prev)
            erase(it);
        else
        {
            prev=it;
            ++it;
        }
    }
    return *this;
}